

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O0

void __thiscall Octree::build(Octree *this,Mesh *m)

{
  float fVar1;
  bool bVar2;
  vector<Triangle,_std::allocator<Triangle>_> *this_00;
  const_reference pvVar3;
  Vector3f *pVVar4;
  size_type sVar5;
  float *pfVar6;
  uint *puVar7;
  uint local_78;
  uint ii_1;
  allocator<int> local_61;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> trigs;
  int dim;
  Vector3f *v;
  int vi;
  value_type *t;
  uint ii;
  vector<Triangle,_std::allocator<Triangle>_> *tri;
  Mesh *m_local;
  Octree *this_local;
  
  this->mesh = m;
  this_00 = Mesh::getTriangles(this->mesh);
  bVar2 = std::vector<Triangle,_std::allocator<Triangle>_>::empty(this_00);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!tri.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Octree.cpp"
                  ,0x73,"void Octree::build(Mesh *)");
  }
  pvVar3 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this_00,0);
  pVVar4 = Triangle::getVertex(pvVar3,0);
  Vector3f::operator=(&(this->box).mn,pVVar4);
  pvVar3 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this_00,0);
  pVVar4 = Triangle::getVertex(pvVar3,0);
  Vector3f::operator=(&(this->box).mx,pVVar4);
  t._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<Triangle,_std::allocator<Triangle>_>::size(this_00);
    if (sVar5 <= t._4_4_) break;
    pvVar3 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[](this_00,(ulong)t._4_4_);
    for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
      pVVar4 = Triangle::getVertex(pvVar3,v._4_4_);
      for (trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ = 0;
          trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 3;
          trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ + 1) {
        pfVar6 = Vector3f::operator[]
                           (&(this->box).mn,
                            trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
        fVar1 = *pfVar6;
        pfVar6 = Vector3f::operator[]
                           (pVVar4,trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_);
        if (*pfVar6 <= fVar1 && fVar1 != *pfVar6) {
          pfVar6 = Vector3f::operator[]
                             (pVVar4,trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
          fVar1 = *pfVar6;
          pfVar6 = Vector3f::operator[]
                             (&(this->box).mn,
                              trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
          *pfVar6 = fVar1;
        }
        pfVar6 = Vector3f::operator[]
                           (&(this->box).mx,
                            trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
        fVar1 = *pfVar6;
        pfVar6 = Vector3f::operator[]
                           (pVVar4,trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_);
        if (fVar1 < *pfVar6) {
          pfVar6 = Vector3f::operator[]
                             (pVVar4,trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
          fVar1 = *pfVar6;
          pfVar6 = Vector3f::operator[]
                             (&(this->box).mx,
                              trigs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
          *pfVar6 = fVar1;
        }
      }
    }
    t._4_4_ = t._4_4_ + 1;
  }
  sVar5 = std::vector<Triangle,_std::allocator<Triangle>_>::size(this_00);
  std::allocator<int>::allocator(&local_61);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,sVar5,&local_61);
  std::allocator<int>::~allocator(&local_61);
  local_78 = 0;
  while( true ) {
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_60);
    if (sVar5 <= local_78) break;
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_60,(ulong)local_78);
    *puVar7 = local_78;
    local_78 = local_78 + 1;
  }
  buildNode(this,&this->root,&this->box,(vector<int,_std::allocator<int>_> *)local_60,this->mesh,0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  return;
}

Assistant:

void
Octree::build(Mesh *m) {
    mesh = m;

    const auto &tri = mesh->getTriangles();
    assert(!tri.empty());

    // compute bounding box for m
    box.mn = tri[0].getVertex(0);
    box.mx = tri[0].getVertex(0);
    for (unsigned int ii = 0; ii < tri.size(); ii++) {
        const auto &t = tri[ii];
        for (int vi = 0; vi < 3; ++vi) {
            const auto &v = t.getVertex(vi);
            for (int dim = 0; dim < 3; dim++) {
                if (box.mn[dim] > v[dim]) {
                    box.mn[dim] = v[dim];
                }
                if (box.mx[dim] < v[dim]) {
                    box.mx[dim] = v[dim];
                }
            }
        }
    }

    std::vector<int> trigs(tri.size());
    for (unsigned int ii = 0; ii < trigs.size(); ii++) {
        trigs[ii] = ii;
    }
    buildNode(&root, box, trigs, *mesh, 0);
}